

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void init_stuff(void)

{
  _Bool _Var1;
  char local_608 [8];
  char datapath [512];
  char libpath [512];
  char configpath [512];
  
  my_strcpy(libpath + 0x1f8,"./lib/",0x200);
  my_strcpy(datapath + 0x1f8,"./lib/",0x200);
  my_strcpy(local_608,"./lib/",0x200);
  libpath[0x1f7] = '\0';
  datapath[0x1f7] = '\0';
  _Var1 = suffix(libpath + 0x1f8,"/");
  if (!_Var1) {
    my_strcat(libpath + 0x1f8,"/",0x200);
  }
  _Var1 = suffix(datapath + 0x1f8,"/");
  if (!_Var1) {
    my_strcat(datapath + 0x1f8,"/",0x200);
  }
  _Var1 = suffix(local_608,"/");
  if (!_Var1) {
    my_strcat(local_608,"/",0x200);
  }
  init_file_paths(libpath + 0x1f8,datapath + 0x1f8,local_608);
  return;
}

Assistant:

static void init_stuff(void)
{
	char configpath[512];
	char libpath[512];
	char datapath[512];

	/* Use the angband_path, or a default */
	my_strcpy(configpath, DEFAULT_CONFIG_PATH, sizeof(configpath));
	my_strcpy(libpath, DEFAULT_LIB_PATH, sizeof(libpath));
	my_strcpy(datapath, DEFAULT_DATA_PATH, sizeof(datapath));

	/* Make sure they're terminated */
	configpath[511] = '\0';
	libpath[511] = '\0';
	datapath[511] = '\0';

	/* Hack -- Add a path separator (only if needed) */
	if (!suffix(configpath, PATH_SEP)) my_strcat(configpath, PATH_SEP,
												 sizeof(configpath));
	if (!suffix(libpath, PATH_SEP)) my_strcat(libpath, PATH_SEP,
											  sizeof(libpath));
	if (!suffix(datapath, PATH_SEP)) my_strcat(datapath, PATH_SEP,
											   sizeof(datapath));

	/* Initialize */
	init_file_paths(configpath, libpath, datapath);
}